

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ssize_t __thiscall smf::MidiFile::write(MidiFile *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  ostream *poVar4;
  ssize_t sVar5;
  undefined8 uVar6;
  undefined1 uVar7;
  undefined7 uVar8;
  void *__buf_00;
  undefined4 in_register_00000034;
  undefined1 local_230 [8];
  fstream output;
  undefined1 local_220 [512];
  string *local_20;
  string *filename_local;
  MidiFile *this_local;
  
  local_20 = (string *)CONCAT44(in_register_00000034,__fd);
  uVar7 = (undefined1)__n;
  uVar8 = (undefined7)(__n >> 8);
  filename_local = (string *)this;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_bin,_S_out);
  std::fstream::fstream(local_230,pcVar3,_Var2);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: could not write: ");
    poVar4 = std::operator<<(poVar4,local_20);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
  }
  else {
    sVar5 = write(this,(int)local_220,__buf_00,CONCAT71(uVar8,uVar7));
    this->m_rwstatus = (bool)((byte)sVar5 & 1);
    std::fstream::close();
    this_local._7_1_ = this->m_rwstatus & 1;
  }
  uVar6 = std::fstream::~fstream(local_230);
  return CONCAT71((int7)((ulong)uVar6 >> 8),this_local._7_1_) & 0xffffffffffffff01;
}

Assistant:

bool MidiFile::write(const std::string& filename) {
	std::fstream output(filename.c_str(), std::ios::binary | std::ios::out);

	if (!output.is_open()) {
		std::cerr << "Error: could not write: " << filename << std::endl;
		return false;
	}
	m_rwstatus = write(output);
	output.close();
	return m_rwstatus;
}